

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::DeleteTexture::DeleteTexture
          (DeleteTexture *this,SharedPtr<deqp::egl::GLES2ThreadTest::Texture> *texture,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_28;
  
  Operation::Operation(&this->super_Operation,"DeleteTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DeleteTexture_01e08378;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Texture>::SharedPtr(&this->m_texture,texture);
  local_28.m_ptr = &((this->m_texture).m_ptr)->super_Object;
  local_28.m_state = (this->m_texture).m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Operation::modifyGLObject(&this->super_Operation,&local_28);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::release(&local_28);
  return;
}

Assistant:

DeleteTexture::DeleteTexture (SharedPtr<Texture> texture, bool useSync, bool serverSync)
	: Operation		("DeleteTexture", useSync, serverSync)
	, m_texture		(texture)
{
	modifyGLObject(SharedPtr<Object>(m_texture));
}